

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O0

tuple<baryonyx::problem,_baryonyx::problem> *
baryonyx::split(tuple<baryonyx::problem,_baryonyx::problem> *__return_storage_ptr__,context *ctx,
               problem *pb,int variable_index_to_affect)

{
  bool bVar1;
  problem *ctx_00;
  int iVar2;
  const_reference arg1;
  size_t size;
  tuple<double,_baryonyx::show_size_type> *mem;
  problem local_338;
  problem local_240;
  undefined1 local_148 [8];
  preprocessor<baryonyx::problem> pp;
  baryonyx local_58 [16];
  string local_48;
  int local_24;
  problem *ppStack_20;
  int variable_index_to_affect_local;
  problem *pb_local;
  context *ctx_local;
  
  bVar1 = false;
  local_24 = variable_index_to_affect;
  ppStack_20 = pb;
  pb_local = (problem *)ctx;
  ctx_local = (context *)__return_storage_ptr__;
  if (-1 < variable_index_to_affect) {
    iVar2 = length<std::vector<baryonyx::variable_value,std::allocator<baryonyx::variable_value>>>
                      (&(pb->vars).values);
    bVar1 = variable_index_to_affect < iVar2;
  }
  ctx_00 = pb_local;
  if (!bVar1) {
    details::fail_fast("Precondition",
                       "variable_index_to_affect >= 0 && variable_index_to_affect < length(pb.vars.values)"
                       ,
                       "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/preprocessor.cpp"
                       ,"870");
  }
  arg1 = std::
         vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
         ::operator[](&(ppStack_20->vars).names,(long)local_24);
  size = memory_consumed(ppStack_20);
  memory_consumed_size<unsigned_long>(local_58,size);
  to_string_abi_cxx11_(&local_48,local_58,mem);
  info<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>
            ((context *)ctx_00,"  - Preprocessor starts split of variable {} (size: {})\n",arg1,
             &local_48);
  std::__cxx11::string::~string((string *)&local_48);
  anon_unknown.dwarf_f00bc::preprocessor<baryonyx::problem>::preprocessor
            ((preprocessor<baryonyx::problem> *)local_148,(context *)pb_local,ppStack_20);
  anon_unknown.dwarf_f00bc::preprocessor<baryonyx::problem>::operator()
            (&local_240,(preprocessor<baryonyx::problem> *)local_148,local_24,true);
  anon_unknown.dwarf_f00bc::preprocessor<baryonyx::problem>::operator()
            (&local_338,(preprocessor<baryonyx::problem> *)local_148,local_24,false);
  std::make_tuple<baryonyx::problem,baryonyx::problem>(__return_storage_ptr__,&local_240,&local_338)
  ;
  problem::~problem(&local_338);
  problem::~problem(&local_240);
  anon_unknown.dwarf_f00bc::preprocessor<baryonyx::problem>::~preprocessor
            ((preprocessor<baryonyx::problem> *)local_148);
  return __return_storage_ptr__;
}

Assistant:

std::tuple<problem, problem>
split(const context& ctx, const problem& pb, int variable_index_to_affect)
{
    bx_expects(variable_index_to_affect >= 0 &&
               variable_index_to_affect < length(pb.vars.values));

    info(ctx,
         "  - Preprocessor starts split of variable {} (size: {})\n",
         pb.vars.names[variable_index_to_affect],
         to_string(memory_consumed_size(memory_consumed(pb))));

    ::preprocessor<problem> pp(ctx, pb);

    return std::make_tuple(pp(variable_index_to_affect, true),
                           pp(variable_index_to_affect, false));
}